

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *fields,
               FlatAllocator *alloc)

{
  TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pTVar1;
  Base<google::protobuf::FieldOptions> *pBVar2;
  void *pvVar3;
  FieldNameCase FVar4;
  Rep *pRVar5;
  basic_string_view<char,_std::char_traits<char>_> *pbVar6;
  char *pcVar7;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  long *plVar8;
  int array_size;
  undefined1 in_R8B;
  size_t *psVar9;
  void **ppvVar10;
  string_view name;
  string_view input;
  string_view input_00;
  string json_name;
  string lowercase_name;
  string camelcase_name;
  string local_e8;
  long *local_c8;
  undefined8 local_c0;
  long local_b8 [2];
  string local_a8;
  void **local_88;
  void **local_80;
  size_t local_78;
  size_t local_70;
  undefined8 local_68;
  long *local_60;
  size_type local_58;
  pointer local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined1 local_38 [8];
  
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) {
LAB_001fc989:
    PlanAllocationSize((protobuf *)&local_78);
LAB_001fc993:
    internal::protobuf_assumption_failed
              ("!value || _impl_.options_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
               ,0x3906);
  }
  pTVar1 = &(alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_;
  (pTVar1->payload_).super_Base<char>.value =
       (pTVar1->payload_).super_Base<char>.value +
       (fields->super_RepeatedPtrFieldBase).current_size_ * 0x58;
  ppvVar10 = (void **)fields;
  if (((ulong)(fields->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = internal::RepeatedPtrFieldBase::rep(&fields->super_RepeatedPtrFieldBase);
    ppvVar10 = pRVar5->elements;
    in_RDX = extraout_RDX;
  }
  local_88 = (void **)fields;
  if (((ulong)(fields->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar5 = internal::RepeatedPtrFieldBase::rep(&fields->super_RepeatedPtrFieldBase);
    local_88 = pRVar5->elements;
    in_RDX = extraout_RDX_00;
  }
  local_88 = local_88 + (fields->super_RepeatedPtrFieldBase).current_size_;
  if (ppvVar10 != local_88) {
    do {
      pvVar3 = *ppvVar10;
      if (((*(uint *)((long)pvVar3 + 0x10) & 0x20) != 0) && (*(long *)((long)pvVar3 + 0x40) == 0))
      goto LAB_001fc993;
      if ((*(uint *)((long)pvVar3 + 0x10) & 0x20) != 0) {
        if ((alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
          pBVar2 = &(alloc->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ).total_.payload_.super_Base<google::protobuf::FieldOptions>;
          pBVar2->value = pBVar2->value + 1;
          goto LAB_001fc74d;
        }
LAB_001fc97f:
        PlanAllocationSize((protobuf *)&local_78);
        goto LAB_001fc989;
      }
LAB_001fc74d:
      if ((*(byte *)((long)pvVar3 + 0x10) & 0x10) == 0) {
        plVar8 = (long *)0x0;
      }
      else {
        plVar8 = (long *)(*(ulong *)((long)pvVar3 + 0x38) & 0xfffffffffffffffc);
      }
      if ((alloc->
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) {
        PlanAllocationSize((protobuf *)&local_78);
        goto LAB_001fc97f;
      }
      psVar9 = (size_t *)(*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffffc);
      if (plVar8 == (long *)0x0) {
        name._M_str = in_RDX;
        name._M_len = *psVar9;
        FVar4 = anon_unknown_23::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::GetFieldNameCase((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                    *)psVar9[1],name);
        if (FVar4 == 1) {
          array_size = 3;
        }
        else {
          if (FVar4 != 0) goto LAB_001fc777;
          array_size = 2;
        }
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)alloc,array_size);
        in_RDX = extraout_RDX_05;
      }
      else {
LAB_001fc777:
        local_c8 = local_b8;
        local_80 = ppvVar10;
        std::__cxx11::string::_M_construct<char*>((string *)&local_c8,*psVar9,psVar9[1] + *psVar9);
        absl::lts_20240722::AsciiStrToLower((string *)&local_c8);
        input._M_str = (char *)0x1;
        input._M_len = *psVar9;
        pcVar7 = (char *)0x1;
        (anonymous_namespace)::ToCamelCase_abi_cxx11_
                  (&local_a8,(_anonymous_namespace_ *)psVar9[1],input,(bool)in_R8B);
        if (plVar8 == (long *)0x0) {
          input_00._M_str = pcVar7;
          input_00._M_len = *psVar9;
          (anonymous_namespace)::ToJsonName_abi_cxx11_
                    (&local_e8,(_anonymous_namespace_ *)psVar9[1],input_00);
        }
        else {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_e8,*plVar8,plVar8[1] + *plVar8)
          ;
        }
        local_70 = *psVar9;
        local_78 = psVar9[1];
        local_68 = local_c0;
        local_60 = local_c8;
        local_58 = local_a8._M_string_length;
        local_50 = local_a8._M_dataplus._M_p;
        local_48 = local_e8._M_string_length;
        local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_e8._M_dataplus._M_p;
        std::
        __insertion_sort<std::basic_string_view<char,std::char_traits<char>>*,__gnu_cxx::__ops::_Iter_less_iter>
                  (&local_78,local_38);
        pbVar6 = std::
                 __unique<std::basic_string_view<char,std::char_traits<char>>*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (&local_78,local_38);
        ppvVar10 = local_80;
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)alloc,(int)((ulong)((long)pbVar6 - (long)&local_78) >> 4) + 1);
        in_RDX = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          in_RDX = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          in_RDX = extraout_RDX_03;
        }
        if (local_c8 != local_b8) {
          operator_delete(local_c8,local_b8[0] + 1);
          in_RDX = extraout_RDX_04;
        }
      }
      if (((~*(uint *)((long)pvVar3 + 0x10) & 0x408) == 0) &&
         ((*(int *)((long)pvVar3 + 0x58) == 0xc || (*(int *)((long)pvVar3 + 0x58) == 9)))) {
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)alloc,1);
        in_RDX = extraout_RDX_06;
      }
      ppvVar10 = ppvVar10 + 1;
    } while (ppvVar10 != local_88);
  }
  return;
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }